

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

void MCTS::assertion_failed(char *expr,char *file_cstr,int line)

{
  size_t sVar1;
  ostream *poVar2;
  runtime_error *this;
  string file;
  stringstream sout;
  char *local_1e8;
  long local_1e0;
  char *local_1c8;
  ostream *local_1a8 [2];
  long local_198 [47];
  
  std::__cxx11::string::string((string *)&local_1e8,file_cstr,(allocator *)local_1a8);
  std::__cxx11::string::find_last_of((char *)&local_1e8,0x10f1d8,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1e8);
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  if (local_1a8[0] != (ostream *)local_198) {
    operator_delete(local_1a8[0]);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Assertion failed: ",0x12)
  ;
  if (expr == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen(expr);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,expr,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," in ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void assertion_failed(const char* expr, const char* file_cstr, int line)
{
	using namespace std;

	// Extract the file name only.
	string file(file_cstr);
	auto pos = file.find_last_of("/\\");
	if (pos == string::npos) {
		pos = 0;
	}
	file = file.substr(pos + 1);  // Returns empty string if pos + 1 == length.

	stringstream sout;
	sout << "Assertion failed: " << expr << " in " << file << ":" << line << ".";
	throw runtime_error(sout.str().c_str());
}